

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++.cc
# Opt level: O1

void __thiscall osqp::OsqpSettings::OsqpSettings(OsqpSettings *this)

{
  OSQPSettings osqp_settings;
  OSQPSettings local_c0;
  
  osqp_set_default_settings(&local_c0);
  this->rho = local_c0.rho;
  this->sigma = local_c0.sigma;
  this->scaling = local_c0.scaling;
  this->adaptive_rho = local_c0.adaptive_rho != 0;
  this->adaptive_rho_interval = local_c0.adaptive_rho_interval;
  this->adaptive_rho_tolerance = local_c0.adaptive_rho_tolerance;
  this->adaptive_rho_fraction = local_c0.adaptive_rho_fraction;
  this->max_iter = local_c0.max_iter;
  this->eps_abs = local_c0.eps_abs;
  this->eps_rel = local_c0.eps_rel;
  this->eps_prim_inf = local_c0.eps_prim_inf;
  this->eps_dual_inf = local_c0.eps_dual_inf;
  this->alpha = local_c0.alpha;
  this->delta = local_c0.delta;
  this->polish = local_c0.polish != 0;
  this->polish_refine_iter = local_c0.polish_refine_iter;
  this->verbose = local_c0.verbose != 0;
  this->scaled_termination = local_c0.scaled_termination != 0;
  this->check_termination = local_c0.check_termination;
  this->warm_start = local_c0.warm_start != 0;
  this->time_limit = local_c0.time_limit;
  return;
}

Assistant:

OsqpSettings::OsqpSettings() {
  ::OSQPSettings osqp_settings;
  osqp_set_default_settings(&osqp_settings);
  CopyFromInternalSettings(osqp_settings, this);
}